

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLogOn_RefreshOnLogonHelper::RunImpl
          (initiatorFixtureLogOn_RefreshOnLogonHelper *this)

{
  int64_t *this_00;
  Message *pMVar1;
  TestResults *this_01;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_630;
  UtcTimeStamp local_610;
  Logon local_5f8;
  undefined1 local_4a0 [8];
  Message receivedLogon;
  Logon local_348;
  Message local_1f0 [8];
  Message sentLogon;
  undefined1 local_88 [8];
  UtcTimeStamp time;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixtureLogOn_RefreshOnLogonHelper *local_10;
  initiatorFixtureLogOn_RefreshOnLogonHelper *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  this_00 = &time.super_DateTime.m_time;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)this_00,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,
             (UtcTimeOnly *)this_00);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)this_00);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_88);
  FIX::Session::setRefreshOnLogon((this->super_initiatorFixture).super_sessionFixture.object,true);
  createLogon(&local_348,"TW","ISLD",1);
  FIX::Message::Message(local_1f0,(Message *)&local_348);
  FIX42::Logon::~Logon(&local_348);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon(&local_5f8,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_4a0,(Message *)&local_5f8);
  FIX42::Logon::~Logon(&local_5f8);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_610);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_4a0,SUB81(&local_610,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_610);
  bVar2 = FIX::Session::isLoggedOn((this->super_initiatorFixture).super_sessionFixture.object);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_01 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_630,*ppTVar4,0x7ee);
    UnitTest::TestResults::OnTestFailure(this_01,&local_630,"object->isLoggedOn()");
  }
  FIX::Message::~Message((Message *)local_4a0);
  FIX::Message::~Message(local_1f0);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_88);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOn_RefreshOnLogon) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;
  object->setRefreshOnLogon(true);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(object->isLoggedOn());
}